

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  uint uVar30;
  undefined4 uVar31;
  undefined4 uVar34;
  ulong uVar32;
  Geometry *pGVar33;
  RTCIntersectFunctionN p_Var35;
  NodeRef nodeRef;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar40;
  size_t sVar41;
  Geometry *pGVar42;
  ulong uVar43;
  ulong uVar44;
  StackItemMaskT<embree::NodeRefPtr<8>_> *pSVar45;
  ulong uVar46;
  bool bVar47;
  undefined8 uVar48;
  vint4 ai;
  undefined1 auVar51 [16];
  undefined8 uVar49;
  undefined8 uVar50;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  float fVar57;
  float fVar58;
  float fVar63;
  float fVar65;
  vint4 ai_1;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 ai_3;
  undefined1 auVar69 [16];
  undefined4 uVar70;
  vint4 bi;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  vint4 bi_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 uVar78;
  vint4 bi_3;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 ai_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi_2;
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  vint<4> octant;
  undefined8 local_2748;
  vint4 bi_8;
  undefined1 local_2698 [16];
  RTCIntersectFunctionNArguments local_2680;
  Geometry *local_2650;
  undefined8 local_2648;
  RTCIntersectArguments *local_2640;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_2638;
  undefined4 local_2628;
  undefined4 uStack_2624;
  undefined4 uStack_2620;
  undefined4 uStack_261c;
  undefined1 local_2618 [16];
  float local_2608;
  float fStack_2604;
  float fStack_2600;
  float fStack_25fc;
  float local_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float local_25e8;
  float fStack_25e4;
  float fStack_25e0;
  float fStack_25dc;
  undefined1 local_25d8 [16];
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined1 local_2588 [16];
  float local_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float fStack_2560;
  float fStack_255c;
  float local_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  vint<4> mask;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  
  auVar4 = vpcmpeqd_avx(in_ZMM12._0_16_,in_ZMM12._0_16_);
  auVar90 = ZEXT1664(auVar4);
  auVar51 = vpcmpeqd_avx(auVar4,(undefined1  [16])valid_i->field_0);
  uVar30 = vmovmskps_avx(auVar51);
  if (uVar30 == 0) {
    return;
  }
  local_2638 = valid_i->field_0;
  pAVar1 = This->ptr;
  uVar39 = (ulong)(uVar30 & 0xff);
  auVar75._8_4_ = 0x7fffffff;
  auVar75._0_8_ = 0x7fffffff7fffffff;
  auVar75._12_4_ = 0x7fffffff;
  auVar62 = *(undefined1 (*) [16])(ray + 0x40);
  auVar72 = vandps_avx(auVar62,auVar75);
  auVar79._8_4_ = 0x219392ef;
  auVar79._0_8_ = 0x219392ef219392ef;
  auVar79._12_4_ = 0x219392ef;
  auVar72 = vcmpps_avx(auVar72,auVar79,1);
  auVar59 = vblendvps_avx(auVar62,auVar79,auVar72);
  auVar72 = *(undefined1 (*) [16])(ray + 0x50);
  auVar89 = vandps_avx(auVar72,auVar75);
  auVar89 = vcmpps_avx(auVar89,auVar79,1);
  auVar60 = vblendvps_avx(auVar72,auVar79,auVar89);
  auVar89 = *(undefined1 (*) [16])(ray + 0x60);
  auVar75 = vandps_avx(auVar89,auVar75);
  auVar75 = vcmpps_avx(auVar75,auVar79,1);
  auVar75 = vblendvps_avx(auVar89,auVar79,auVar75);
  auVar71 = vrcpps_avx(auVar59);
  auVar81._8_4_ = 0x3f800000;
  auVar81._0_8_ = 0x3f8000003f800000;
  auVar81._12_4_ = 0x3f800000;
  auVar59 = vfnmadd213ps_fma(auVar59,auVar71,auVar81);
  local_25b8 = vfmadd132ps_fma(auVar59,auVar71,auVar71);
  auVar91 = ZEXT1664(local_25b8);
  auVar59 = vrcpps_avx(auVar60);
  auVar60 = vfnmadd213ps_fma(auVar60,auVar59,auVar81);
  local_25c8 = vfmadd132ps_fma(auVar60,auVar59,auVar59);
  auVar92 = ZEXT1664(local_25c8);
  auVar59 = vrcpps_avx(auVar75);
  auVar75 = vfnmadd213ps_fma(auVar75,auVar59,auVar81);
  local_25d8 = vfmadd132ps_fma(auVar75,auVar59,auVar59);
  auVar93 = ZEXT1664(local_25d8);
  auVar79 = ZEXT816(0) << 0x40;
  auVar87 = ZEXT1664(auVar79);
  auVar75 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar79);
  local_2618 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar79);
  auVar88 = ZEXT1664(auVar4 ^ auVar51);
  auVar62 = vcmpps_avx(auVar62,auVar79,1);
  auVar59._8_4_ = 1;
  auVar59._0_8_ = 0x100000001;
  auVar59._12_4_ = 1;
  auVar62 = vandps_avx(auVar62,auVar59);
  auVar72 = vcmpps_avx(auVar72,auVar79,1);
  auVar71._8_4_ = 2;
  auVar71._0_8_ = 0x200000002;
  auVar71._12_4_ = 2;
  auVar72 = vandps_avx(auVar72,auVar71);
  auVar72 = vorps_avx(auVar72,auVar62);
  auVar60._8_4_ = 4;
  auVar60._0_8_ = 0x400000004;
  auVar60._12_4_ = 4;
  auVar62 = vcmpps_avx(auVar89,auVar79,1);
  auVar62 = vandps_avx(auVar62,auVar60);
  auVar4 = vpor_avx(auVar4 ^ auVar51,auVar62);
  local_2698 = vpor_avx(auVar4,auVar72);
  local_25e8 = *(float *)ray;
  fStack_25e4 = *(float *)(ray + 4);
  fStack_25e0 = *(float *)(ray + 8);
  fStack_25dc = *(float *)(ray + 0xc);
  fVar57 = local_25b8._0_4_ * -*(float *)ray;
  fVar63 = local_25b8._4_4_ * -*(float *)(ray + 4);
  fVar65 = local_25b8._8_4_ * -*(float *)(ray + 8);
  fVar67 = local_25b8._12_4_ * -*(float *)(ray + 0xc);
  local_25f8 = *(float *)(ray + 0x10);
  fStack_25f4 = *(float *)(ray + 0x14);
  fStack_25f0 = *(float *)(ray + 0x18);
  fStack_25ec = *(float *)(ray + 0x1c);
  fVar58 = local_25c8._0_4_ * -*(float *)(ray + 0x10);
  fVar64 = local_25c8._4_4_ * -*(float *)(ray + 0x14);
  fVar66 = local_25c8._8_4_ * -*(float *)(ray + 0x18);
  fVar68 = local_25c8._12_4_ * -*(float *)(ray + 0x1c);
  local_2608 = *(float *)(ray + 0x20);
  fStack_2604 = *(float *)(ray + 0x24);
  fStack_2600 = *(float *)(ray + 0x28);
  fStack_25fc = *(float *)(ray + 0x2c);
  local_2558 = local_25d8._0_4_ * -*(float *)(ray + 0x20);
  fStack_2554 = local_25d8._4_4_ * -*(float *)(ray + 0x24);
  fStack_2550 = local_25d8._8_4_ * -*(float *)(ray + 0x28);
  fStack_254c = local_25d8._12_4_ * -*(float *)(ray + 0x2c);
  local_2598 = mm_lookupmask_ps._0_8_;
  uStack_2590 = mm_lookupmask_ps._8_8_;
  local_2628 = 0x7f800000;
  uStack_2624 = 0x7f800000;
  uStack_2620 = 0x7f800000;
  uStack_261c = 0x7f800000;
  do {
    lVar16 = 0;
    for (uVar32 = uVar39; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
      lVar16 = lVar16 + 1;
    }
    uVar31 = *(undefined4 *)(local_2698 + lVar16 * 4);
    auVar51._4_4_ = uVar31;
    auVar51._0_4_ = uVar31;
    auVar51._8_4_ = uVar31;
    auVar51._12_4_ = uVar31;
    auVar52 = vpcmpeqd_avx(auVar51,local_2698);
    uVar34 = (undefined4)((ulong)lVar16 >> 0x20);
    uVar31 = vmovmskps_avx(auVar52);
    stack[0].mask = CONCAT44(uVar34,uVar31);
    auVar72._4_4_ = fStack_25e4;
    auVar72._0_4_ = local_25e8;
    auVar72._8_4_ = fStack_25e0;
    auVar72._12_4_ = fStack_25dc;
    auVar84._8_4_ = 0x7f800000;
    auVar84._0_8_ = 0x7f8000007f800000;
    auVar84._12_4_ = 0x7f800000;
    auVar4 = vblendvps_avx(auVar84,auVar72,auVar52);
    uVar39 = ~stack[0].mask & uVar39;
    auVar51 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vminps_avx(auVar51,auVar4);
    auVar51 = vshufpd_avx(auVar4,auVar4,1);
    auVar51 = vminps_avx(auVar51,auVar4);
    auVar5._4_4_ = fStack_25f4;
    auVar5._0_4_ = local_25f8;
    auVar5._8_4_ = fStack_25f0;
    auVar5._12_4_ = fStack_25ec;
    auVar4 = vblendvps_avx(auVar84,auVar5,auVar52);
    auVar62 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vminps_avx(auVar62,auVar4);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vminps_avx(auVar62,auVar4);
    auVar51 = vinsertps_avx(auVar51,auVar4,0x1c);
    auVar89._4_4_ = fStack_2604;
    auVar89._0_4_ = local_2608;
    auVar89._8_4_ = fStack_2600;
    auVar89._12_4_ = fStack_25fc;
    auVar4 = vblendvps_avx(auVar84,auVar89,auVar52);
    auVar62 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vminps_avx(auVar62,auVar4);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar62 = vminps_avx(auVar62,auVar4);
    auVar82._8_4_ = 0xff800000;
    auVar82._0_8_ = 0xff800000ff800000;
    auVar82._12_4_ = 0xff800000;
    auVar4 = vblendvps_avx(auVar82,auVar72,auVar52);
    auVar72 = vinsertps_avx(auVar51,auVar62,0x20);
    auVar51 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vmaxps_avx(auVar51,auVar4);
    auVar51 = vshufpd_avx(auVar4,auVar4,1);
    auVar51 = vmaxps_avx(auVar51,auVar4);
    auVar4 = vblendvps_avx(auVar82,auVar5,auVar52);
    auVar62 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vmaxps_avx(auVar62,auVar4);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vmaxps_avx(auVar62,auVar4);
    auVar51 = vinsertps_avx(auVar51,auVar4,0x1c);
    auVar4 = vblendvps_avx(auVar82,auVar89,auVar52);
    auVar62 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vmaxps_avx(auVar62,auVar4);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar62 = vmaxps_avx(auVar62,auVar4);
    auVar4 = vblendvps_avx(auVar84,auVar91._0_16_,auVar52);
    auVar89 = vinsertps_avx(auVar51,auVar62,0x20);
    auVar51 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vminps_avx(auVar51,auVar4);
    auVar51 = vshufpd_avx(auVar4,auVar4,1);
    auVar51 = vminps_avx(auVar51,auVar4);
    auVar4 = vblendvps_avx(auVar84,auVar92._0_16_,auVar52);
    auVar62 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vminps_avx(auVar62,auVar4);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vminps_avx(auVar62,auVar4);
    auVar51 = vinsertps_avx(auVar51,auVar4,0x1c);
    auVar4 = vblendvps_avx(auVar84,auVar93._0_16_,auVar52);
    auVar62 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vminps_avx(auVar62,auVar4);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar62 = vminps_avx(auVar62,auVar4);
    auVar4 = vblendvps_avx(auVar82,auVar91._0_16_,auVar52);
    auVar59 = vinsertps_avx(auVar51,auVar62,0x20);
    auVar51 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vmaxps_avx(auVar51,auVar4);
    auVar51 = vshufpd_avx(auVar4,auVar4,1);
    auVar51 = vmaxps_avx(auVar51,auVar4);
    auVar4 = vblendvps_avx(auVar82,auVar92._0_16_,auVar52);
    auVar62 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vmaxps_avx(auVar62,auVar4);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar4 = vmaxps_avx(auVar62,auVar4);
    auVar51 = vinsertps_avx(auVar51,auVar4,0x1c);
    auVar4 = vblendvps_avx(auVar82,auVar93._0_16_,auVar52);
    auVar62 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar4 = vmaxps_avx(auVar62,auVar4);
    auVar62 = vshufpd_avx(auVar4,auVar4,1);
    auVar62 = vmaxps_avx(auVar62,auVar4);
    auVar4 = vblendvps_avx(auVar84,auVar75,auVar52);
    auVar60 = vinsertps_avx(auVar51,auVar62,0x20);
    auVar51 = vshufps_avx(auVar4,auVar4,0xb1);
    auVar79 = vminps_avx(auVar51,auVar4);
    auVar5 = vshufpd_avx(auVar79,auVar79,1);
    bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   vblendvps_avx(auVar82,local_2618,auVar52);
    auVar71 = vshufps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])bi_8.field_0,0xb1);
    auVar62 = vcmpps_avx(auVar59,auVar87._0_16_,5);
    auVar4 = vblendvps_avx(auVar60,auVar59,auVar62);
    auVar51 = vblendvps_avx(auVar72,auVar89,auVar62);
    local_2578 = auVar51._0_4_;
    fStack_2574 = auVar51._4_4_;
    fStack_2570 = auVar51._8_4_;
    fStack_256c = auVar51._12_4_;
    auVar71 = vmaxps_avx(auVar71,(undefined1  [16])bi_8.field_0);
    auVar51 = vblendvps_avx(auVar89,auVar72,auVar62);
    fStack_2568 = auVar4._0_4_;
    auVar81 = vmovshdup_avx(auVar4);
    uVar46 = (ulong)(auVar81._0_4_ < 0.0) << 5 | 0x40;
    auVar72 = vshufpd_avx(auVar4,auVar4,1);
    auVar82 = auVar88._0_16_;
    auVar76 = vshufpd_avx(auVar71,auVar71,1);
    uVar37 = (ulong)(auVar72._0_4_ < 0.0) << 5 | 0x80;
    auVar89 = vminps_avx(auVar5,auVar79);
    auVar72 = vmaxps_avx(auVar76,auVar71);
    auVar88 = ZEXT1664(auVar82);
    auVar87 = ZEXT864(0) << 0x20;
    auVar62 = vblendvps_avx(auVar59,auVar60,auVar62);
    auVar83._0_4_ = fStack_2568 * local_2578;
    auVar83._4_4_ = auVar4._4_4_ * fStack_2574;
    auVar83._8_4_ = auVar4._8_4_ * fStack_2570;
    auVar83._12_4_ = auVar4._12_4_ * fStack_256c;
    fVar3 = auVar62._0_4_;
    auVar76._0_4_ = auVar51._0_4_ * fVar3;
    auVar76._4_4_ = auVar51._4_4_ * auVar62._4_4_;
    auVar76._8_4_ = auVar51._8_4_ * auVar62._8_4_;
    auVar76._12_4_ = auVar51._12_4_ * auVar62._12_4_;
    uVar44 = (ulong)(fStack_2568 < 0.0) * 0x20;
    stack[0].ptr.ptr = *(size_t *)&pAVar1[1].bounds.bounds0.lower.field_0;
    local_2578 = fStack_2568;
    fStack_2574 = fStack_2568;
    fStack_2570 = fStack_2568;
    fStack_256c = fStack_2568;
    fStack_2564 = fStack_2568;
    fStack_2560 = fStack_2568;
    fStack_255c = fStack_2568;
    local_2748 = auVar81._0_8_;
    auVar51 = vmovshdup_avx(auVar83);
    uVar30 = auVar51._0_4_;
    uVar9 = auVar51._4_4_;
    auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
    uVar48 = auVar4._0_8_;
    auVar60 = vshufps_avx(auVar83,auVar83,0xaa);
    uVar6 = auVar60._0_4_;
    uVar10 = auVar60._4_4_;
    auVar4 = vmovshdup_avx(auVar62);
    uVar49 = auVar4._0_8_;
    auVar59 = vmovshdup_avx(auVar76);
    uVar7 = auVar59._0_4_;
    uVar11 = auVar59._4_4_;
    auVar4 = vshufps_avx(auVar62,auVar62,0xaa);
    uVar50 = auVar4._0_8_;
    auVar62 = vshufps_avx(auVar76,auVar76,0xaa);
    uVar8 = auVar62._0_4_;
    uVar12 = auVar62._4_4_;
    uVar70 = auVar89._0_4_;
    auVar74 = ZEXT1664(auVar52);
    uVar78 = auVar72._0_4_;
    uVar31 = vmovmskps_avx(auVar82);
    uVar32 = CONCAT44(uVar34,uVar31);
    auVar4._4_4_ = uStack_2624;
    auVar4._0_4_ = local_2628;
    auVar4._8_4_ = uStack_2620;
    auVar4._12_4_ = uStack_261c;
    auVar4 = vblendvps_avx(auVar4,auVar75,auVar52);
    auVar56 = ZEXT1664(auVar4);
    auVar85 = ZEXT1664(CONCAT412(fVar67,CONCAT48(fVar65,CONCAT44(fVar63,fVar57))));
    auVar86 = ZEXT1664(CONCAT412(fVar68,CONCAT48(fVar66,CONCAT44(fVar64,fVar58))));
    pSVar40 = stack + 1;
    do {
      auVar89 = auVar88._0_16_;
      local_2650 = (Geometry *)~uVar32;
      auVar72 = auVar74._0_16_;
      while( true ) {
        pSVar45 = pSVar40 + -1;
        if ((pSVar40[-1].mask & (ulong)local_2650) == 0) goto LAB_005f383e;
        uVar32 = (pSVar45->ptr).ptr;
        uVar36 = uVar32;
        if ((uVar32 & 8) != 0) break;
        while( true ) {
          uVar32 = CONCAT44(auVar83._0_4_,auVar83._0_4_);
          auVar29._8_4_ = -auVar83._0_4_;
          auVar29._0_8_ = uVar32 ^ 0x8000000080000000;
          auVar29._12_4_ = -auVar83._0_4_;
          auVar29._16_4_ = -auVar83._0_4_;
          auVar29._20_4_ = -auVar83._0_4_;
          auVar29._24_4_ = -auVar83._0_4_;
          auVar29._28_4_ = -auVar83._0_4_;
          auVar13._4_4_ = fStack_2574;
          auVar13._0_4_ = local_2578;
          auVar13._8_4_ = fStack_2570;
          auVar13._12_4_ = fStack_256c;
          auVar13._16_4_ = fStack_2568;
          auVar13._20_4_ = fStack_2564;
          auVar13._24_4_ = fStack_2560;
          auVar13._28_4_ = fStack_255c;
          auVar71 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar44),auVar29,auVar13);
          auVar27._8_4_ = uVar30 ^ 0x80000000;
          auVar27._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
          auVar27._12_4_ = uVar9 ^ 0x80000000;
          auVar27._16_4_ = uVar30 ^ 0x80000000;
          auVar27._20_4_ = uVar9 ^ 0x80000000;
          auVar27._24_4_ = uVar30 ^ 0x80000000;
          auVar27._28_4_ = uVar9 ^ 0x80000000;
          auVar28._8_8_ = local_2748;
          auVar28._0_8_ = local_2748;
          auVar28._16_8_ = local_2748;
          auVar28._24_8_ = local_2748;
          auVar79 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar46),auVar27,auVar28);
          auVar13 = vpmaxsd_avx2(ZEXT1632(auVar71),ZEXT1632(auVar79));
          auVar25._8_4_ = uVar6 ^ 0x80000000;
          auVar25._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
          auVar25._12_4_ = uVar10 ^ 0x80000000;
          auVar25._16_4_ = uVar6 ^ 0x80000000;
          auVar25._20_4_ = uVar10 ^ 0x80000000;
          auVar25._24_4_ = uVar6 ^ 0x80000000;
          auVar25._28_4_ = uVar10 ^ 0x80000000;
          auVar26._8_8_ = uVar48;
          auVar26._0_8_ = uVar48;
          auVar26._16_8_ = uVar48;
          auVar26._24_8_ = uVar48;
          auVar71 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar37),auVar25,auVar26);
          auVar14._4_4_ = uVar70;
          auVar14._0_4_ = uVar70;
          auVar14._8_4_ = uVar70;
          auVar14._12_4_ = uVar70;
          auVar14._16_4_ = uVar70;
          auVar14._20_4_ = uVar70;
          auVar14._24_4_ = uVar70;
          auVar14._28_4_ = uVar70;
          auVar14 = vpmaxsd_avx2(ZEXT1632(auVar71),auVar14);
          auVar13 = vpmaxsd_avx2(auVar13,auVar14);
          uVar32 = CONCAT44(auVar76._0_4_,auVar76._0_4_);
          auVar23._8_4_ = -auVar76._0_4_;
          auVar23._0_8_ = uVar32 ^ 0x8000000080000000;
          auVar23._12_4_ = -auVar76._0_4_;
          auVar23._16_4_ = -auVar76._0_4_;
          auVar23._20_4_ = -auVar76._0_4_;
          auVar23._24_4_ = -auVar76._0_4_;
          auVar23._28_4_ = -auVar76._0_4_;
          auVar24._4_4_ = fVar3;
          auVar24._0_4_ = fVar3;
          auVar24._8_4_ = fVar3;
          auVar24._12_4_ = fVar3;
          auVar24._16_4_ = fVar3;
          auVar24._20_4_ = fVar3;
          auVar24._24_4_ = fVar3;
          auVar24._28_4_ = fVar3;
          auVar71 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar44 ^ 0x20)),auVar23,
                                    auVar24);
          auVar21._8_4_ = uVar7 ^ 0x80000000;
          auVar21._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
          auVar21._12_4_ = uVar11 ^ 0x80000000;
          auVar21._16_4_ = uVar7 ^ 0x80000000;
          auVar21._20_4_ = uVar11 ^ 0x80000000;
          auVar21._24_4_ = uVar7 ^ 0x80000000;
          auVar21._28_4_ = uVar11 ^ 0x80000000;
          auVar22._8_8_ = uVar49;
          auVar22._0_8_ = uVar49;
          auVar22._16_8_ = uVar49;
          auVar22._24_8_ = uVar49;
          auVar79 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar46 ^ 0x20)),auVar21,
                                    auVar22);
          auVar14 = vpminsd_avx2(ZEXT1632(auVar71),ZEXT1632(auVar79));
          auVar19._8_4_ = uVar8 ^ 0x80000000;
          auVar19._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
          auVar19._12_4_ = uVar12 ^ 0x80000000;
          auVar19._16_4_ = uVar8 ^ 0x80000000;
          auVar19._20_4_ = uVar12 ^ 0x80000000;
          auVar19._24_4_ = uVar8 ^ 0x80000000;
          auVar19._28_4_ = uVar12 ^ 0x80000000;
          auVar20._8_8_ = uVar50;
          auVar20._0_8_ = uVar50;
          auVar20._16_8_ = uVar50;
          auVar20._24_8_ = uVar50;
          auVar71 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar37 ^ 0x20)),auVar19,
                                    auVar20);
          auVar15._4_4_ = uVar78;
          auVar15._0_4_ = uVar78;
          auVar15._8_4_ = uVar78;
          auVar15._12_4_ = uVar78;
          auVar15._16_4_ = uVar78;
          auVar15._20_4_ = uVar78;
          auVar15._24_4_ = uVar78;
          auVar15._28_4_ = uVar78;
          auVar15 = vpminsd_avx2(ZEXT1632(auVar71),auVar15);
          auVar14 = vpminsd_avx2(auVar14,auVar15);
          auVar13 = vcmpps_avx(auVar13,auVar14,2);
          auVar56 = ZEXT3264(auVar13);
          uVar38 = vmovmskps_avx(auVar13);
          pSVar40 = pSVar45;
          if (uVar38 == 0) break;
          uVar43 = (ulong)(uVar38 & 0xff);
          uVar32 = 8;
          sVar41 = 0;
          do {
            lVar16 = 0;
            for (uVar17 = uVar43; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar31 = *(undefined4 *)(uVar36 + 0x40 + lVar16 * 4);
            auVar52._4_4_ = uVar31;
            auVar52._0_4_ = uVar31;
            auVar52._8_4_ = uVar31;
            auVar52._12_4_ = uVar31;
            auVar81 = vfmadd213ps_fma(auVar52,auVar91._0_16_,auVar85._0_16_);
            uVar31 = *(undefined4 *)(uVar36 + 0x80 + lVar16 * 4);
            auVar61._4_4_ = uVar31;
            auVar61._0_4_ = uVar31;
            auVar61._8_4_ = uVar31;
            auVar61._12_4_ = uVar31;
            auVar52 = vfmadd213ps_fma(auVar61,auVar92._0_16_,auVar86._0_16_);
            uVar31 = *(undefined4 *)(uVar36 + 0xc0 + lVar16 * 4);
            auVar69._4_4_ = uVar31;
            auVar69._0_4_ = uVar31;
            auVar69._8_4_ = uVar31;
            auVar69._12_4_ = uVar31;
            auVar18._4_4_ = fStack_2554;
            auVar18._0_4_ = local_2558;
            auVar18._8_4_ = fStack_2550;
            auVar18._12_4_ = fStack_254c;
            auVar5 = vfmadd213ps_fma(auVar69,auVar93._0_16_,auVar18);
            uVar31 = *(undefined4 *)(uVar36 + 0x60 + lVar16 * 4);
            auVar73._4_4_ = uVar31;
            auVar73._0_4_ = uVar31;
            auVar73._8_4_ = uVar31;
            auVar73._12_4_ = uVar31;
            auVar82 = vfmadd213ps_fma(auVar73,auVar91._0_16_,auVar85._0_16_);
            uVar31 = *(undefined4 *)(uVar36 + 0xa0 + lVar16 * 4);
            auVar77._4_4_ = uVar31;
            auVar77._0_4_ = uVar31;
            auVar77._8_4_ = uVar31;
            auVar77._12_4_ = uVar31;
            auVar84 = vfmadd213ps_fma(auVar77,auVar92._0_16_,auVar86._0_16_);
            uVar31 = *(undefined4 *)(uVar36 + 0xe0 + lVar16 * 4);
            auVar80._4_4_ = uVar31;
            auVar80._0_4_ = uVar31;
            auVar80._8_4_ = uVar31;
            auVar80._12_4_ = uVar31;
            auVar18 = vfmadd213ps_fma(auVar80,auVar93._0_16_,auVar18);
            auVar71 = vpminsd_avx(auVar81,auVar82);
            auVar79 = vpminsd_avx(auVar52,auVar84);
            auVar71 = vpmaxsd_avx(auVar71,auVar79);
            auVar79 = vpminsd_avx(auVar5,auVar18);
            auVar79 = vpmaxsd_avx(auVar79,auVar4);
            auVar71 = vpmaxsd_avx(auVar71,auVar79);
            auVar79 = vpmaxsd_avx(auVar81,auVar82);
            auVar81 = vpmaxsd_avx(auVar52,auVar84);
            auVar81 = vpminsd_avx(auVar79,auVar81);
            auVar79 = vpmaxsd_avx(auVar5,auVar18);
            auVar79 = vpminsd_avx(auVar79,(undefined1  [16])bi_8.field_0);
            auVar79 = vpminsd_avx(auVar81,auVar79);
            auVar71 = vcmpps_avx(auVar71,auVar79,2);
            auVar56 = ZEXT1664(auVar71);
            uVar38 = vmovmskps_avx(auVar71);
            if (uVar38 != 0) {
              uVar17 = *(ulong *)(uVar36 + lVar16 * 8);
              if (uVar32 != 8) {
                (pSVar45->ptr).ptr = uVar32;
                pSVar45->mask = sVar41;
                pSVar45 = pSVar45 + 1;
              }
              sVar41 = (size_t)(uVar38 & 0xff);
              uVar32 = uVar17;
            }
            auVar74 = ZEXT1664(auVar72);
            uVar43 = uVar43 - 1 & uVar43;
          } while (uVar43 != 0);
          pSVar40 = pSVar45;
          if (uVar32 == 8) break;
          uVar36 = uVar32;
          if ((uVar32 & 8) != 0) {
            if (sVar41 == 0) goto LAB_005f383e;
            goto LAB_005f3676;
          }
        }
        auVar54 = auVar56._0_16_;
        if (pSVar40 == stack) goto LAB_005f384c;
      }
LAB_005f3676:
      auVar71 = auVar74._0_16_;
      pGVar33 = (Geometry *)((ulong)((uint)uVar32 & 0xf) - 8);
      local_2650 = pGVar33;
      auVar54 = auVar89;
      if (pGVar33 != (Geometry *)0x0) {
        local_2588 = auVar89 ^ auVar90._0_16_;
        local_25a8 = auVar89;
        pGVar42 = (Geometry *)0x1;
        do {
          local_2680.geomID = *(uint *)(((uVar32 & 0xfffffffffffffff0) - 8) + (long)pGVar42 * 8);
          local_2650 = (context->scene->geometries).items[local_2680.geomID].ptr;
          uVar38 = local_2650->mask;
          auVar53._4_4_ = uVar38;
          auVar53._0_4_ = uVar38;
          auVar53._8_4_ = uVar38;
          auVar53._12_4_ = uVar38;
          auVar89 = vpand_avx(auVar53,*(undefined1 (*) [16])(ray + 0x90));
          auVar89 = vpcmpeqd_avx(auVar87._0_16_,auVar89);
          auVar71 = local_2588 & ~auVar89;
          auVar2._8_8_ = uStack_2590;
          auVar2._0_8_ = local_2598;
          auVar79 = local_2588;
          if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar71[0xf] < '\0') {
            mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                           vandnps_avx(auVar89,local_2588);
            local_2680.primID = *(uint *)(((uVar32 & 0xfffffffffffffff0) - 4) + (long)pGVar42 * 8);
            local_2680.valid = (int *)&mask;
            local_2680.geometryUserPtr = local_2650->userPtr;
            local_2680.context = context->user;
            local_2680.N = 4;
            local_2648 = 0;
            local_2640 = context->args;
            p_Var35 = local_2640->intersect;
            if (p_Var35 == (RTCIntersectFunctionN)0x0) {
              p_Var35 = (RTCIntersectFunctionN)
                        local_2650[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                        _M_i;
            }
            auVar89 = auVar90._0_16_;
            local_2680.rayhit = (RTCRayHitN *)ray;
            local_2650 = (Geometry *)(*p_Var35)(&local_2680);
            auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar2 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
            auVar89 = vpcmpeqd_avx(auVar89,auVar89);
            auVar90 = ZEXT1664(auVar89);
            auVar91 = ZEXT1664(local_25b8);
            auVar92 = ZEXT1664(local_25c8);
            auVar93 = ZEXT1664(local_25d8);
            auVar88 = ZEXT1664(local_25a8);
            auVar85 = ZEXT1664(CONCAT412(fVar67,CONCAT48(fVar65,CONCAT44(fVar63,fVar57))));
            auVar86 = ZEXT1664(CONCAT412(fVar68,CONCAT48(fVar66,CONCAT44(fVar64,fVar58))));
            auVar74 = ZEXT1664(auVar72);
            auVar79 = local_2588;
          }
          auVar71 = auVar74._0_16_;
          auVar89 = auVar88._0_16_;
          local_2588 = vandnps_avx(auVar2,auVar79);
          auVar79 = auVar79 & ~auVar2;
        } while (((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar79[0xf] < '\0') &&
                (local_2650 = (Geometry *)((long)&(pGVar42->super_RefCount)._vptr_RefCount + 1),
                bVar47 = pGVar42 < pGVar33, pGVar42 = local_2650, bVar47));
        auVar54._0_4_ = auVar90._0_4_ ^ local_2588._0_4_;
        auVar54._4_4_ = auVar90._4_4_ ^ local_2588._4_4_;
        auVar54._8_4_ = auVar90._8_4_ ^ local_2588._8_4_;
        auVar54._12_4_ = auVar90._12_4_ ^ local_2588._12_4_;
      }
      auVar72 = vorps_avx(auVar89,auVar54);
      auVar88 = ZEXT1664(auVar72);
      auVar89 = auVar71 & ~auVar72;
      if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar89 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar89 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar89[0xf])
      break;
      auVar89 = vandnps_avx(auVar72,auVar71);
      auVar74 = ZEXT1664(auVar89);
      auVar55._8_4_ = 0xff800000;
      auVar55._0_8_ = 0xff800000ff800000;
      auVar55._12_4_ = 0xff800000;
      auVar56 = ZEXT1664(auVar55);
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx((undefined1  [16])bi_8.field_0,auVar55,auVar72);
LAB_005f383e:
      auVar54 = auVar56._0_16_;
      uVar31 = vmovmskps_avx(auVar88._0_16_);
      uVar32 = CONCAT44((int)((ulong)local_2650 >> 0x20),uVar31);
      pSVar40 = pSVar45;
    } while (pSVar45 != stack);
LAB_005f384c:
    if (uVar39 == 0) {
      auVar4 = vpcmpeqd_avx(auVar54,auVar54);
      auVar4 = vpcmpeqd_avx(auVar4,(undefined1  [16])local_2638);
      auVar4 = vpand_avx(auVar88._0_16_,auVar4);
      auVar62._8_4_ = 0xff800000;
      auVar62._0_8_ = 0xff800000ff800000;
      auVar62._12_4_ = 0xff800000;
      auVar4 = vmaskmovps_avx(auVar4,auVar62);
      *(undefined1 (*) [16])(ray + 0x80) = auVar4;
      return;
    }
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }